

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::closeObject(QPDFWriter *this,int objid)

{
  long lVar1;
  string *psVar2;
  size_type sVar3;
  size_type *psVar4;
  qpdf_offset_t qVar5;
  size_t in_RCX;
  size_t idx;
  element_type *peVar6;
  NewObject *this_00;
  
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27b95a,(void *)0x8,in_RCX);
  peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar6->pipeline,0x27bda7,(void *)0x1,in_RCX);
    peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  idx = (size_t)objid;
  lVar1 = *(long *)&(peVar6->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                    super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                    super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                    ._M_impl;
  if (idx < (ulong)((long)*(pointer *)
                           ((long)&(peVar6->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                   super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   .
                                   super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                           + 8) - lVar1 >> 5)) {
    this_00 = (NewObject *)(lVar1 + idx * 0x20);
  }
  else {
    this_00 = ObjTable<QPDFWriter::NewObject>::large_element
                        (&(peVar6->new_obj).super_ObjTable<QPDFWriter::NewObject>,idx);
    peVar6 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  psVar2 = peVar6->pipeline->str;
  psVar4 = (size_type *)&peVar6->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar4 = &psVar2->_M_string_length;
  }
  sVar3 = *psVar4;
  qVar5 = QPDFXRefEntry::getOffset(&this_00->xref);
  this_00->length = sVar3 - qVar5;
  return;
}

Assistant:

void
QPDFWriter::closeObject(int objid)
{
    // Write a newline before endobj as it makes the file easier to repair.
    writeString("\nendobj\n");
    writeStringQDF("\n");
    auto& new_obj = m->new_obj[objid];
    new_obj.length = m->pipeline->getCount() - new_obj.xref.getOffset();
}